

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall
CLIntercept::startAubCapture
          (CLIntercept *this,char *functionName,uint64_t enqueueCounter,cl_kernel kernel,
          cl_uint workDim,size_t *gws,size_t *lws,cl_command_queue command_queue)

{
  uint uVar1;
  uint uVar2;
  __useconds_t __useconds;
  pointer pcVar3;
  int iVar4;
  mapped_type *__k;
  iterator iVar5;
  long lVar6;
  long *plVar7;
  undefined8 uVar8;
  mapped_type *pmVar9;
  cl_kernel p_Var10;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar12;
  ostringstream ss;
  char charBuf [256];
  string local_318;
  pthread_mutex_t *local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  undefined1 *local_2d0;
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0 [6];
  ios_base local_240 [264];
  char local_138 [264];
  
  if (this->m_AubCaptureStarted != false) {
    return;
  }
  local_2f8 = (pthread_mutex_t *)&this->m_Mutex;
  iVar4 = pthread_mutex_lock(local_2f8);
  if (iVar4 != 0) {
    uVar8 = std::__throw_system_error(iVar4);
    if (local_2d0 != local_2c0) {
      operator_delete(local_2d0);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
    std::ios_base::~ios_base(local_240);
    if (local_2f0._M_dataplus._M_p != (pointer)enqueueCounter) {
      operator_delete(local_2f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p);
    }
    pthread_mutex_unlock(local_2f8);
    _Unwind_Resume(uVar8);
  }
  if (kernel != (cl_kernel)0x0) {
    if (this->m_AubCaptureKernelEnqueueSkipCounter <
        (this->m_Config).AubCaptureNumKernelEnqueuesSkip) {
      this->m_AubCaptureKernelEnqueueSkipCounter = this->m_AubCaptureKernelEnqueueSkipCounter + 1;
      goto LAB_001832f7;
    }
    uVar2 = this->m_AubCaptureKernelEnqueueCaptureCounter;
    uVar1 = (this->m_Config).AubCaptureNumKernelEnqueuesCapture;
    this->m_AubCaptureKernelEnqueueCaptureCounter = uVar2 + 1;
    if (uVar1 <= uVar2) goto LAB_001832f7;
  }
  if (this->m_AubCaptureStarted == false) {
    (*(this->m_Dispatch).clFinish)(command_queue);
    local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"");
    std::__cxx11::string::string((string *)local_2b0,sc_DumpDirectoryName,(allocator *)&local_2f0);
    OS::Services_Common::GetDumpDirectoryName
              (&(this->m_OS).super_Services_Common,(string *)local_2b0,&local_318);
    if ((cl_kernel)local_2b0._0_8_ != (cl_kernel)(local_2b0 + 0x10)) {
      operator_delete((void *)local_2b0._0_8_);
    }
    std::__cxx11::string::append((char *)&local_318);
    std::__cxx11::string::append((char *)&local_318);
    if ((this->m_Config).AubCaptureIndividualEnqueues == true) {
      std::__cxx11::string::append((char *)&local_318);
      snprintf(local_138,0x100,"%08u",enqueueCounter & 0xffffffff);
      std::__cxx11::string::append((char *)&local_318);
      std::__cxx11::string::append((char *)&local_318);
      if (kernel == (cl_kernel)0x0) {
        std::__cxx11::string::append((char *)&local_318);
      }
      else {
        local_2b0._0_8_ = kernel;
        __k = std::
              map<_cl_kernel_*,_CLIntercept::SKernelInfo,_std::less<_cl_kernel_*>,_std::allocator<std::pair<_cl_kernel_*const,_CLIntercept::SKernelInfo>_>_>
              ::operator[](&this->m_KernelInfoMap,(key_type *)local_2b0);
        iVar5 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&(this->m_LongKernelNameMap)._M_h,&__k->KernelName);
        pmVar9 = (mapped_type *)
                 ((long)iVar5.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                        ._M_cur + 0x28);
        if (iVar5.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
            ._M_cur == (__node_type *)0x0) {
          pmVar9 = __k;
        }
        pcVar3 = (pmVar9->KernelName)._M_dataplus._M_p;
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2f0,pcVar3,pcVar3 + (pmVar9->KernelName)._M_string_length);
        std::__cxx11::string::append((char *)&local_318);
        std::__cxx11::string::_M_append((char *)&local_318,(ulong)local_2f0._M_dataplus._M_p);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2b0);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"_G_",3);
        if (gws == (size_t *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"NULL",4);
        }
        else if ((workDim != 0) &&
                (std::ostream::_M_insert<unsigned_long>((ulong)local_2b0), workDim != 1)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"x",1);
          std::ostream::_M_insert<unsigned_long>((ulong)local_2b0);
          if (2 < workDim) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"x",1);
            std::ostream::_M_insert<unsigned_long>((ulong)local_2b0);
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"_L_",3);
        if (lws == (size_t *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"NULL",4);
        }
        else if ((workDim != 0) &&
                (std::ostream::_M_insert<unsigned_long>((ulong)local_2b0), workDim != 1)) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"x",1);
          std::ostream::_M_insert<unsigned_long>((ulong)local_2b0);
          if (2 < workDim) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2b0,"x",1);
            std::ostream::_M_insert<unsigned_long>((ulong)local_2b0);
          }
        }
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append((char *)&local_318,(ulong)local_2d0);
        if (local_2d0 != local_2c0) {
          operator_delete(local_2d0);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2b0);
        std::ios_base::~ios_base(local_240);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
          operator_delete(local_2f0._M_dataplus._M_p);
        }
      }
    }
    else if (((this->m_Config).AubCaptureMinEnqueue != 0) ||
            ((this->m_Config).AubCaptureMaxEnqueue != 0xffffffff)) {
      std::__cxx11::string::append((char *)&local_318);
      snprintf(local_138,0x100,"%08u",(ulong)(this->m_Config).AubCaptureMinEnqueue);
      std::__cxx11::string::append((char *)&local_318);
      std::__cxx11::string::append((char *)&local_318);
      snprintf(local_138,0x100,"%08u",(ulong)(this->m_Config).AubCaptureMaxEnqueue);
      std::__cxx11::string::append((char *)&local_318);
    }
    lVar6 = std::__cxx11::string::find((char *)&local_318,0x19d01b,0);
    lVar6 = std::__cxx11::string::find((char *)&local_318,0x19d01b,lVar6 + 1);
    if (lVar6 != -1) {
      do {
        std::__cxx11::string::substr((ulong)local_2b0,(ulong)&local_318);
        mkdir((char *)local_2b0._0_8_,0x1ff);
        if ((cl_kernel)local_2b0._0_8_ != (cl_kernel)(local_2b0 + 0x10)) {
          operator_delete((void *)local_2b0._0_8_);
        }
        lVar6 = std::__cxx11::string::find((char *)&local_318,0x19d01b,lVar6 + 1);
      } while (lVar6 != -1);
    }
    std::__cxx11::string::append((char *)&local_318);
    __useconds = (this->m_Config).AubCaptureStartWait;
    if (__useconds != 0) {
      usleep(__useconds);
    }
    iVar4 = setenv("AUBDumpToggleCaptureOnOff","1",1);
    if (iVar4 == 0) {
      if (local_318._M_string_length == 0) {
        unsetenv("AUBDumpToggleFileName");
      }
      else {
        setenv("AUBDumpToggleFileName",local_318._M_dataplus._M_p,1);
      }
    }
    std::operator+(&local_2f0,"AubCapture started... maybe.  File name is: ",&local_318);
    plVar7 = (long *)std::__cxx11::string::append((char *)&local_2f0);
    local_2b0._0_8_ = local_2b0 + 0x10;
    p_Var10 = (cl_kernel)(plVar7 + 2);
    if ((cl_kernel)*plVar7 == p_Var10) {
      uVar11 = *(undefined4 *)p_Var10;
      uVar12 = *(undefined4 *)((long)plVar7 + 0x14);
      local_2a0[0]._0_8_ = *(undefined8 *)p_Var10;
      local_2a0[0]._8_4_ = (undefined4)plVar7[3];
      local_2a0[0]._12_4_ = *(undefined4 *)((long)plVar7 + 0x1c);
    }
    else {
      local_2a0[0]._0_8_ = *(undefined8 *)p_Var10;
      uVar11 = extraout_XMM0_Da;
      uVar12 = extraout_XMM0_Db;
      local_2b0._0_8_ = (cl_kernel)*plVar7;
    }
    local_2b0._8_8_ = plVar7[1];
    *plVar7 = (long)p_Var10;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    log(this,(double)CONCAT44(uVar12,uVar11));
    if ((cl_kernel)local_2b0._0_8_ != (cl_kernel)(local_2b0 + 0x10)) {
      operator_delete((void *)local_2b0._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p);
    }
    this->m_AubCaptureStarted = true;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p);
    }
  }
LAB_001832f7:
  pthread_mutex_unlock(local_2f8);
  return;
}

Assistant:

void CLIntercept::startAubCapture(
    const char* functionName,
    const uint64_t enqueueCounter,
    const cl_kernel kernel,
    const cl_uint workDim,
    const size_t* gws,
    const size_t* lws,
    cl_command_queue command_queue )
{
    if( m_AubCaptureStarted == false )
    {
        std::lock_guard<std::mutex> lock(m_Mutex);

        // For kernels, perform aub capture skip checks.  We'll skip aubcapture if:
        // - the current skip counter is less than the specified skip counter, or
        // - the current capture counter is greater than or equal to the specified capture counter.

        bool    skip = false;
        if( kernel != NULL )
        {
            if( m_AubCaptureKernelEnqueueSkipCounter < m_Config.AubCaptureNumKernelEnqueuesSkip )
            {
                //logf( "Skipping kernel aub capture: current skip counter is %u, requested skip counter is %u.\n",
                //    m_AubCaptureKernelEnqueueSkipCounter,
                //    m_Config.AubCaptureNumKernelEnqueuesSkip );

                skip = true;
                ++m_AubCaptureKernelEnqueueSkipCounter;
            }
            else
            {
                if( m_AubCaptureKernelEnqueueCaptureCounter >= m_Config.AubCaptureNumKernelEnqueuesCapture )
                {
                    //logf( "Skipping kernel aub capture: current capture counter is %u, requested capture counter is %u.\n",
                    //    m_AubCaptureKernelEnqueueCaptureCounter,
                    //    m_Config.AubCaptureNumKernelEnqueuesCapture );
                    skip = true;
                }

                ++m_AubCaptureKernelEnqueueCaptureCounter;
            }
        }

        if( skip == false &&
            m_AubCaptureStarted == false )
        {
            // Try to call clFinish() on the passed-in command queue.
            // This isn't perfect, since we'd really rather call
            // clFinish on all command queues to start with a fresh
            // capture, but it's better than nothing.
            // TODO: Is Flush() sufficient?
            dispatch().clFinish( command_queue );

            char    charBuf[ MAX_PATH ];

            std::string fileName = "";

            // Get the dump directory name.
            {
                OS().GetDumpDirectoryName( sc_DumpDirectoryName, fileName );
                fileName += "/";
                fileName += "AubCapture";

                if( m_Config.AubCaptureIndividualEnqueues )
                {
                    fileName += "_Enqueue_";

                    CLI_SPRINTF( charBuf, MAX_PATH, "%08u", (cl_uint)enqueueCounter );

                    fileName += charBuf;
                    fileName += "_";

                    if( kernel )
                    {
                        const std::string& kernelName = getShortKernelName(kernel);
                        fileName += "kernel_";
                        fileName += kernelName;

                        std::ostringstream  ss;
                        ss << "_G_";
                        if( gws )
                        {
                            if( workDim >= 1 )
                            {
                                ss << gws[0];
                            }
                            if( workDim >= 2 )
                            {
                                ss << "x" << gws[1];
                            }
                            if( workDim >= 3 )
                            {
                                ss << "x" << gws[2];
                            }
                        }
                        else
                        {
                            ss << "NULL";
                        }
                        ss << "_L_";
                        if( lws )
                        {
                            if( workDim >= 1 )
                            {
                                ss << lws[0];
                            }
                            if( workDim >= 2 )
                            {
                                ss << "x" << lws[1];
                            }
                            if( workDim >= 3 )
                            {
                                ss << "x" << lws[2];
                            }
                        }
                        else
                        {
                            ss << "NULL";
                        }
                        fileName += ss.str();
                    }
                    else
                    {
                        fileName += functionName;
                    }
                }
                else if( m_Config.AubCaptureMinEnqueue != 0 ||
                         m_Config.AubCaptureMaxEnqueue != UINT_MAX )
                {
                    fileName += "_Enqueue_";

                    CLI_SPRINTF( charBuf, MAX_PATH, "%08u", m_Config.AubCaptureMinEnqueue );

                    fileName += charBuf;
                    fileName += "_to_";

                    CLI_SPRINTF( charBuf, MAX_PATH, "%08u", m_Config.AubCaptureMaxEnqueue );

                    fileName += charBuf;
                }
            }

            // Now make directories as appropriate.
            {
                OS().MakeDumpDirectories( fileName );
            }

#if defined(_WIN32)
            if( m_Config.AubCaptureKDC )
            {
                fileName += ".daf";
                OS().StartAubCaptureKDC(
                    fileName,
                    config().AubCaptureStartWait );
            }
            else
#endif
            {
                fileName += ".aub";
                OS().StartAubCapture(
                    fileName,
                    config().AubCaptureStartWait );
            }
            log( "AubCapture started... maybe.  File name is: " + fileName + "\n" );

            // No matter what, set the flag that aubcapture is started, so we
            // don't try again.
            m_AubCaptureStarted = true;
        }
    }
}